

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::passHessian(Highs *this,HighsInt dim,HighsInt num_nz,HighsInt format,HighsInt *start,
                  HighsInt *index,double *value)

{
  int iVar1;
  undefined1 uVar2;
  reference pvVar3;
  value_type in_EDX;
  int in_ESI;
  Highs *in_RDI;
  HighsInt num_col;
  HighsHessian *in_stack_00000080;
  HighsHessian hessian;
  HighsStatus in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff04;
  undefined7 in_stack_ffffffffffffff10;
  HighsHessian *in_stack_ffffffffffffff18;
  HighsHessian *in_stack_ffffffffffffff20;
  vector<int,_std::allocator<int>_> local_78 [4];
  value_type local_18;
  int local_14;
  HighsStatus local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  logHeader((Highs *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  HighsHessian::HighsHessian(in_stack_ffffffffffffff20);
  uVar2 = qFormatOk(in_RDI,in_stack_ffffffffffffff04,in_stack_ffffffffffffff00);
  if ((bool)uVar2) {
    iVar1 = (in_RDI->model_).lp_.num_col_;
    if (local_14 == iVar1) {
      if (0 < local_14) {
        std::vector<int,std::allocator<int>>::assign<int_const*,void>
                  ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_ffffffffffffff10),
                   (int *)in_RDI,
                   (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        std::vector<int,_std::allocator<int>_>::resize
                  ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff20,
                   (size_type)in_stack_ffffffffffffff18);
        in_stack_ffffffffffffff04 = local_18;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](local_78,(long)iVar1);
        *pvVar3 = in_stack_ffffffffffffff04;
      }
      if (0 < local_18) {
        std::vector<int,std::allocator<int>>::assign<int_const*,void>
                  ((vector<int,_std::allocator<int>_> *)CONCAT17(uVar2,in_stack_ffffffffffffff10),
                   (int *)in_RDI,
                   (int *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
        std::vector<double,std::allocator<double>>::assign<double_const*,void>
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffff10),(double *)in_RDI,
                   (double *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
      }
      HighsHessian::HighsHessian(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
      in_stack_ffffffffffffff00 = passHessian((Highs *)hessian._0_8_,in_stack_00000080);
      local_4 = in_stack_ffffffffffffff00;
      HighsHessian::~HighsHessian
                ((HighsHessian *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
    }
    else {
      local_4 = kError;
    }
  }
  else {
    highsLogUser(&(in_RDI->options_).super_HighsOptionsStruct.log_options,kError,
                 "Model has illegal Hessian matrix format\n");
    local_4 = kError;
  }
  HighsHessian::~HighsHessian
            ((HighsHessian *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  return local_4;
}

Assistant:

HighsStatus Highs::passHessian(const HighsInt dim, const HighsInt num_nz,
                               const HighsInt format, const HighsInt* start,
                               const HighsInt* index, const double* value) {
  this->logHeader();
  HighsHessian hessian;
  if (!qFormatOk(num_nz, format)) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Model has illegal Hessian matrix format\n");
    return HighsStatus::kError;
  }
  HighsInt num_col = model_.lp_.num_col_;
  if (dim != num_col) return HighsStatus::kError;
  hessian.dim_ = num_col;
  hessian.format_ = HessianFormat::kTriangular;
  if (dim > 0) {
    assert(start != NULL);
    hessian.start_.assign(start, start + num_col);
    hessian.start_.resize(num_col + 1);
    hessian.start_[num_col] = num_nz;
  }
  if (num_nz > 0) {
    assert(index != NULL);
    assert(value != NULL);
    hessian.index_.assign(index, index + num_nz);
    hessian.value_.assign(value, value + num_nz);
  }
  return passHessian(hessian);
}